

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

void ptls_aead__do_encrypt
               (ptls_aead_context_t *ctx,void *output,void *input,size_t inlen,uint64_t seq,
               void *aad,size_t aadlen,ptls_aead_supplementary_encryption_t *supp)

{
  ptls_cipher_context_t *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  void *in_R8;
  ptls_cipher_context_t *in_R9;
  void *in_stack_ffffffffffffffc8;
  
  (**(code **)(in_RDI + 0x18))(in_RDI,in_R8,in_R9,aad);
  (**(code **)(in_RDI + 0x20))(in_RDI,in_RSI,in_RDX,in_RCX);
  (**(code **)(in_RDI + 0x28))(in_RDI,(long)&in_RCX->algo + in_RSI);
  if (seq != 0) {
    ptls_cipher_init(in_R9,in_stack_ffffffffffffffc8);
    memset((void *)(seq + 0x10),0,0x10);
    ptls_cipher_encrypt(in_RCX,in_R8,in_R9,(size_t)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

inline void ptls_aead__do_encrypt(ptls_aead_context_t *ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                  const void *aad, size_t aadlen, ptls_aead_supplementary_encryption_t *supp)
{
    ctx->do_encrypt_init(ctx, seq, aad, aadlen);
    ctx->do_encrypt_update(ctx, output, input, inlen);
    ctx->do_encrypt_final(ctx, (uint8_t *)output + inlen);

    if (supp != NULL) {
        ptls_cipher_init(supp->ctx, supp->input);
        memset(supp->output, 0, sizeof(supp->output));
        ptls_cipher_encrypt(supp->ctx, supp->output, supp->output, sizeof(supp->output));
    }
}